

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkShortNames(Wlc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  Wlc_Obj_t *pWVar4;
  int iVar5;
  uint uVar6;
  int fFound;
  char pBuffer [100];
  
  iVar2 = (p->vCos).nSize;
  uVar1 = Abc_Base10Log(iVar2 - (p->vPos).nSize);
  p_00 = &p->vNameIds;
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pWVar4 = Wlc_NtkCo(p,iVar5);
    if ((pWVar4->field_0x1 & 2) == 0) {
      sprintf(pBuffer,"%s%0*d","fi",(ulong)uVar1,(ulong)(uint)(iVar5 - (p->vPos).nSize));
      iVar2 = Abc_NamStrFindOrAdd(p->pManName,pBuffer,&fFound);
      Vec_IntWriteEntry(p_00,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18),iVar2);
    }
    iVar2 = (p->vCos).nSize;
  }
  for (iVar2 = 0; iVar2 < (p->vCis).nSize; iVar2 = iVar2 + 1) {
    pWVar4 = Wlc_NtkCi(p,iVar2);
    if ((undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x1) {
      sprintf(pBuffer,"%s%0*d","fo",(ulong)uVar1,(ulong)(uint)(iVar2 - (p->vPis).nSize));
      iVar5 = Abc_NamStrFindOrAdd(p->pManName,pBuffer,&fFound);
      Vec_IntWriteEntry(p_00,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18),iVar5);
    }
  }
  uVar1 = (p->vPos).nSize;
  uVar3 = Abc_Base10Log(uVar1);
  for (uVar6 = 0; (int)uVar6 < (int)uVar1; uVar6 = uVar6 + 1) {
    pWVar4 = Wlc_NtkPo(p,uVar6);
    sprintf(pBuffer,"%s%0*d","po",(ulong)uVar3,(ulong)uVar6);
    iVar2 = Abc_NamStrFindOrAdd(p->pManName,pBuffer,&fFound);
    Vec_IntWriteEntry(p_00,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18),iVar2);
    uVar1 = (p->vPos).nSize;
  }
  uVar1 = (p->vPis).nSize;
  uVar3 = Abc_Base10Log(uVar1);
  for (uVar6 = 0; (int)uVar6 < (int)uVar1; uVar6 = uVar6 + 1) {
    pWVar4 = Wlc_NtkPi(p,uVar6);
    sprintf(pBuffer,"%s%0*d","pi",(ulong)uVar3,(ulong)uVar6);
    iVar2 = Abc_NamStrFindOrAdd(p->pManName,pBuffer,&fFound);
    Vec_IntWriteEntry(p_00,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18),iVar2);
    uVar1 = (p->vPis).nSize;
  }
  iVar2 = p->iObj;
  uVar3 = Abc_Base10Log(iVar2 - 1);
  for (uVar1 = 1; (int)uVar1 < iVar2; uVar1 = uVar1 + 1) {
    pWVar4 = Wlc_NtkObj(p,uVar1);
    if ((undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x600) ==
        (undefined1  [24])0x0 &&
        (undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x3d) !=
        (undefined1  [24])0x1) {
      sprintf(pBuffer,"%s%0*d","n",(ulong)uVar3,(ulong)uVar1);
      iVar2 = Abc_NamStrFindOrAdd(p->pManName,pBuffer,&fFound);
      Vec_IntWriteEntry(p_00,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18),iVar2);
    }
    iVar2 = p->iObj;
  }
  return;
}

Assistant:

void Wlc_NtkShortNames( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    char pBuffer[100];
    int nDigits, NameId, fFound, i;
    int nFlops = Wlc_NtkCoNum(p) - Wlc_NtkPoNum(p);
    nDigits = Abc_Base10Log( nFlops );
    Wlc_NtkForEachCo( p, pObj, i )
    {
        if ( Wlc_ObjIsPo(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "fi", nDigits, i - Wlc_NtkPoNum(p) );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    Wlc_NtkForEachCi( p, pObj, i )
    {
        if ( Wlc_ObjIsPi(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "fo", nDigits, i - Wlc_NtkPiNum(p) );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkPoNum(p) );
    Wlc_NtkForEachPo( p, pObj, i )
    {
        sprintf( pBuffer, "%s%0*d", "po", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkPiNum(p) );
    Wlc_NtkForEachPi( p, pObj, i )
    {
        sprintf( pBuffer, "%s%0*d", "pi", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkObjNum(p) );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) || Wlc_ObjIsCo(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "n", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
}